

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateEnterInitializingModeIterativeAsync(HelicsFederate fed,HelicsError *err)

{
  Federate *this;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    helics::Federate::enterInitializingModeIterativeAsync(this);
  }
  return;
}

Assistant:

void helicsFederateEnterInitializingModeIterativeAsync(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->enterInitializingModeIterativeAsync();
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}